

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_s3_cep_dcep(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  int local_3c;
  int32 i;
  mfcc_t *_w;
  mfcc_t *w;
  mfcc_t *f;
  mfcc_t **feat_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x22f,"void feat_s3_cep_dcep(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 1) {
    __assert_fail("feat_n_stream(fcb) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x230,"void feat_s3_cep_dcep(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len != fcb->cepsize * 2) {
    __assert_fail("feat_stream_len(fcb, 0) == feat_cepsize(fcb) * 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x231,"void feat_s3_cep_dcep(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->window_size == 2) {
    memcpy(*feat,*mfc,(long)fcb->cepsize << 2);
    pmVar2 = *feat;
    iVar1 = fcb->cepsize;
    pmVar3 = mfc[2];
    pmVar4 = mfc[-2];
    for (local_3c = 0; local_3c < fcb->cepsize; local_3c = local_3c + 1) {
      pmVar2[(long)iVar1 + (long)local_3c] =
           (mfcc_t)((float)pmVar3[local_3c] - (float)pmVar4[local_3c]);
    }
    return;
  }
  __assert_fail("feat_window_size(fcb) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x232,"void feat_s3_cep_dcep(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s3_cep_dcep(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    int32 i;

    assert(fcb);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_stream_len(fcb, 0) == feat_cepsize(fcb) * 2);
    assert(feat_window_size(fcb) == 2);

    /* CEP */
    memcpy(feat[0], mfc[0], feat_cepsize(fcb) * sizeof(mfcc_t));

    /*
     * DCEP: mfc[2] - mfc[-2];
     */
    f = feat[0] + feat_cepsize(fcb);
    w = mfc[2];
    _w = mfc[-2];

    for (i = 0; i < feat_cepsize(fcb); i++)
        f[i] = w[i] - _w[i];
}